

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_block(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,int32_t *block,int intra,
              int chroma)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint *in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  int j;
  vs_vlc_val *tab;
  int32_t coeff;
  uint32_t sign;
  uint32_t eb2;
  uint32_t eb1;
  uint32_t el;
  uint32_t run;
  uint32_t tmp;
  uint32_t dcd;
  uint32_t dcs;
  int i;
  int in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  uint in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vs_vlc_val *local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  local_34 = 0;
  if (in_R8D != 0) {
    if (*in_RDI == 0) {
      local_38 = 0;
      while( true ) {
        uVar1 = *in_RCX;
        if ((int)uVar1 < 1) {
          uVar1 = -uVar1;
        }
        if ((int)uVar1 < 1 << ((byte)local_38 & 0x1f)) break;
        local_38 = local_38 + 1;
      }
      if ((int)*in_RCX < 0) {
        local_3c = (*in_RCX + (1 << ((byte)local_38 & 0x1f))) - 1;
      }
      else {
        local_3c = *in_RCX;
      }
    }
    iVar2 = vs_vlc(_tmp,_el,_eb2);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (uint32_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
    if (iVar2 != 0) {
      return 1;
    }
    if (*in_RDI == 1) {
      if (local_38 == 0) {
        *in_RCX = 0;
      }
      else if (local_3c < (uint)(1 << ((byte)local_38 - 1 & 0x1f))) {
        *in_RCX = local_3c - ((1 << ((byte)local_38 & 0x1f)) + -1);
        in_stack_ffffffffffffff98 = local_3c;
      }
      else {
        *in_RCX = local_3c;
      }
    }
    local_34 = 1;
  }
  if (*(int *)(in_RDX + 4) == 4) {
    return 0;
  }
  while( true ) {
    if ((in_R8D == 0) || (*(int *)(in_RDX + 0x48) == 0)) {
      if (local_34 == 0) {
        local_60 = block_0_vlc;
      }
      else {
        local_60 = block_vlc;
      }
    }
    else {
      local_60 = block_intra_vlc;
    }
    if (*in_RDI == 0) {
      local_44 = 0;
      while( true ) {
        in_stack_ffffffffffffff97 = 0;
        if (local_34 < 0x40) {
          in_stack_ffffffffffffff97 = in_RCX[local_34] != 0 ^ 0xff;
        }
        if ((in_stack_ffffffffffffff97 & 1) == 0) break;
        local_34 = local_34 + 1;
        local_44 = local_44 + 1;
      }
      if (local_34 == 0x40) {
        local_40 = 0;
      }
      else {
        uVar1 = in_RCX[local_34];
        if (((int)uVar1 < -0x7ff) || (0x7ff < (int)uVar1)) {
          fprintf(_stderr,"Coeff too large\n");
          return 1;
        }
        local_48 = uVar1 & 0xfff;
        uVar3 = uVar1;
        if ((int)uVar1 < 1) {
          uVar3 = -uVar1;
        }
        local_40 = uVar3 | local_44 << 0xc;
        local_54 = (uint)((int)uVar1 < 0);
        in_stack_ffffffffffffff9c = 0;
        while ((local_60[in_stack_ffffffffffffff9c].blen != 0 &&
               (local_60[in_stack_ffffffffffffff9c].val != local_40))) {
          in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1;
        }
        if (((local_60[in_stack_ffffffffffffff9c].val != 0 ^ 0xffU) & 1) != local_40) {
          local_40 = 0xfffff;
        }
        if ((local_40 == 0xfffff) && (*(int *)(in_RSI + 0x224) == 0)) {
          uVar3 = uVar1;
          if ((int)uVar1 < 1) {
            uVar3 = -uVar1;
          }
          if ((int)uVar3 < 0x7f) {
            local_4c = uVar1 & 0xff;
          }
          else {
            uVar3 = uVar1;
            if ((int)uVar1 < 1) {
              uVar3 = -uVar1;
            }
            if (0xfe < (int)uVar3) {
              fprintf(_stderr,"Coeff too large\n");
              return 1;
            }
            if ((int)uVar1 < 0) {
              local_4c = 0x80;
            }
            else {
              local_4c = 0;
            }
            local_50 = uVar1 & 0xff;
          }
        }
        local_34 = local_34 + 1;
      }
    }
    iVar2 = vs_vlc(_tmp,_el,_eb2);
    if (iVar2 != 0) {
      return 1;
    }
    if (local_40 == 0) break;
    if (local_40 == 0xfffff) {
      iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (uint32_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
      if (iVar2 != 0) {
        return 1;
      }
      if (*(int *)(in_RSI + 0x224) == 0) {
        iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (uint32_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
        if (iVar2 != 0) {
          return 1;
        }
        if (local_4c == 0) {
          iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (uint32_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c);
          if (iVar2 != 0) {
            return 1;
          }
          if (local_50 < 0x80) {
            fprintf(_stderr,"Invalid escape code\n");
            return 1;
          }
          local_58 = local_50;
        }
        else if (local_4c == 0x80) {
          iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (uint32_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c);
          if (iVar2 != 0) {
            return 1;
          }
          if ((local_50 == 0) || (0x80 < local_50)) {
            fprintf(_stderr,"Invalid escape code\n");
            return 1;
          }
          local_58 = local_50 | 0xffffff00;
        }
        else {
          local_58 = local_4c;
          if (0x80 < (int)local_4c) {
            local_58 = local_4c | 0xffffff00;
          }
        }
      }
      else {
        iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (uint32_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
        if (iVar2 != 0) {
          return 1;
        }
        if ((local_48 & 0x800) == 0) {
          local_58 = local_48;
        }
        else {
          local_58 = local_48 | 0xfffff000;
        }
        if ((local_48 & 0x7ff) == 0) {
          fprintf(_stderr,"Invalid escape code\n");
          return 1;
        }
      }
    }
    else {
      iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (uint32_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
      if (iVar2 != 0) {
        return 1;
      }
      local_44 = local_40 >> 0xc;
      if (local_54 == 0) {
        local_58 = local_40 & 0xfff;
      }
      else {
        local_58 = -(local_40 & 0xfff);
      }
    }
    if (*in_RDI == 1) {
      if (0x3f < local_34) {
        fprintf(_stderr,"block overflow\n");
        return 1;
      }
      while (local_44 != 0) {
        if (0x3f < local_34) {
          fprintf(_stderr,"block overflow\n");
          return 1;
        }
        in_RCX[local_34] = 0;
        local_44 = local_44 - 1;
        local_34 = local_34 + 1;
      }
      in_RCX[local_34] = local_58;
      local_44 = local_44 - 1;
      local_34 = local_34 + 1;
    }
  }
  if (*in_RDI == 1) {
    while (local_34 < 0x40) {
      in_RCX[local_34] = 0;
      local_34 = local_34 + 1;
    }
  }
  return 0;
}

Assistant:

int h262_block(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, int32_t *block, int intra, int chroma) {
	int i = 0;
	if (intra) {
		uint32_t dcs;
		uint32_t dcd;
		if (str->dir == VS_ENCODE) {
			dcs = 0;
			while (abs(block[0]) >= (1 << dcs))
				dcs++;
			if (block[0] >= 0) {
				dcd = block[0];
			} else {
				dcd = block[0] + (1 << dcs) - 1;
			}
		}
		if (vs_vlc(str, &dcs, chroma?dcs_chroma_vlc:dcs_luma_vlc)) return 1;
		if (vs_u(str, &dcd, dcs)) return 1;
		if (str->dir == VS_DECODE) {
			if (!dcs) {
				block[0] = 0;
			} else {
				if (dcd >= (1 << (dcs - 1)))
					block[0] = dcd;
				else
					block[0] = dcd - ((1 << dcs) - 1);
			}
		}
		i = 1;
	}
	if (picparm->picture_coding_type == H262_PIC_TYPE_D)
		return 0;
	while (1) {
		uint32_t tmp, run, el, eb1, eb2, sign;
		int32_t coeff;
		const struct vs_vlc_val *tab;
		if (intra && picparm->intra_vlc_format)
			tab = block_intra_vlc;
		else if (i == 0)
			tab = block_0_vlc;
		else
			tab = block_vlc;
		if (str->dir == VS_ENCODE) {
			run = 0;
			while (i < 64 && !block[i])
				i++, run++;
			if (i == 64) {
				tmp = 0;
			} else {
				coeff = block[i];
				if (coeff <= -0x800 || coeff >= 0x800) {
					fprintf(stderr, "Coeff too large\n");
					return 1;
				}
				el = coeff & 0xfff;
				tmp = abs(coeff) | run << 12;
				sign = coeff < 0;
				int j;
				for (j = 0; tab[j].blen; j++) {
					if (tab[j].val == tmp) {
						break;
					}
				}
				if (!tab[j].val != tmp)
					tmp = 0xfffff;
				if (tmp == 0xfffff && !seqparm->is_ext) {
					/* make MPEG1 escape codes */
					if (abs(coeff) < 127) {
						eb1 = coeff & 0xff;
					} else if (abs(coeff) < 255) {
						if (coeff < 0)
							eb1 = 0x80;
						else
							eb1 = 0;
						eb2 = coeff & 0xff;
					} else {
						fprintf(stderr, "Coeff too large\n");
						return 1;
					}
				}
				i++;
			}
		}
		if (vs_vlc(str, &tmp, tab)) return 1;
		if (tmp == 0) {
			/* end of block */
			if (str->dir == VS_DECODE) {
				while (i < 64)
					block[i++] = 0;
			}
			return 0;
		} else if (tmp == 0xfffff) {
			if (vs_u(str, &run, 6)) return 1;
			if (seqparm->is_ext) {
				/* MPEG2 escape */
				if (vs_u(str, &el, 12)) return 1;
				if (el & 0x800)
					coeff = el | -0x1000;
				else
					coeff = el;
				if (!(el & 0x7ff)) {
					fprintf(stderr, "Invalid escape code\n");
					return 1;
				}
			} else {
				/* MPEG1 escape */
				if (vs_u(str, &eb1, 8)) return 1;
				if (eb1 == 0) {
					if (vs_u(str, &eb2, 8)) return 1;
					if (eb2 < 0x80) {
						fprintf(stderr, "Invalid escape code\n");
						return 1;
					}
					coeff = eb2;
				} else if (eb1 == 0x80) {
					if (vs_u(str, &eb2, 8)) return 1;
					if (eb2 == 0 || eb2 > 0x80) {
						fprintf(stderr, "Invalid escape code\n");
						return 1;
					}
					coeff = eb2 | -0x100;
				} else {
					coeff = eb1;
					if (coeff > 0x80)
						coeff |= -0x100;
				}
			}
		} else {
			/* normal coefficient */
			if (vs_u(str, &sign, 1)) return 1;
			run = tmp >> 12;
			if (sign)
				coeff = -(tmp & 0xfff);
			else
				coeff = tmp & 0xfff;
		}
		if (str->dir == VS_DECODE) {
			if (i >= 64) {
				fprintf(stderr, "block overflow\n");
				return 1;
			}
			while (run--) {
				if (i >= 64) {
					fprintf(stderr, "block overflow\n");
					return 1;
				}
				block[i++] = 0;
			}
			block[i++] = coeff;
		}
	}
}